

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRString * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::
allocate<diligent_spirv_cross::SPIRString&>
          (ObjectPool<diligent_spirv_cross::SPIRString> *this,SPIRString *p)

{
  Vector<diligent_spirv_cross::SPIRString_*> *this_00;
  size_t sVar1;
  pointer pcVar2;
  _Tuple_impl<0UL,_diligent_spirv_cross::SPIRString_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>
  _Var3;
  _Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false> _Var4;
  ulong count;
  SPIRString *pSVar5;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>._M_head_impl =
         (_Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>)malloc(count * 0x30);
    if (_Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>._M_head_impl !=
        (SPIRString *)0x0) {
      SmallVector<diligent_spirv_cross::SPIRString_*,_0UL>::reserve(this_00,count);
      _Var4._M_head_impl =
           (SPIRString *)
           _Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<diligent_spirv_cross::SPIRString_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.
                           buffer_size + 1);
        sVar1 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.buffer_size;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.ptr[sVar1] =
             _Var4._M_head_impl;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.buffer_size = sVar1 + 1
        ;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRString_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>
      .super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false> =
           _Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRString,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRString>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRString_*,_false>._M_head_impl !=
          (SPIRString *)0x0) goto LAB_0034271e;
    }
    pSVar5 = (SPIRString *)0x0;
  }
  else {
LAB_0034271e:
    sVar1 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRString_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<diligent_spirv_cross::SPIRString_*,_0UL>::resize(this_00,sVar1 - 1);
    }
    (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_0093a628;
    (pSVar5->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRString_0093a710;
    (pSVar5->str)._M_dataplus._M_p = (pointer)&(pSVar5->str).field_2;
    pcVar2 = (p->str)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar5->str,pcVar2,pcVar2 + (p->str)._M_string_length);
  }
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}